

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glTFAsset.h
# Opt level: O0

string * __thiscall glTF::Buffer::GetURI_abi_cxx11_(string *__return_storage_ptr__,Buffer *this)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38;
  Buffer *local_18;
  Buffer *this_local;
  
  local_18 = this;
  this_local = (Buffer *)__return_storage_ptr__;
  std::__cxx11::string::string((string *)&local_38,(string *)&(this->super_Object).id);
  std::operator+(__return_storage_ptr__,&local_38,".bin");
  std::__cxx11::string::~string((string *)&local_38);
  return __return_storage_ptr__;
}

Assistant:

std::string GetURI()
            { return std::string(this->id) + ".bin"; }